

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,int i)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_00;
  size_type sVar7;
  reference pvVar8;
  iterator __first;
  iterator __last;
  int local_74;
  vector<int,_std::allocator<int>_> *pvStack_70;
  int j_1;
  NodeList *component;
  cmGraphNodeList local_58;
  int local_38;
  int local_34;
  int c;
  int j;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_28;
  const_iterator ni;
  EdgeList *nl;
  cmComputeComponentGraph *pcStack_10;
  int i_local;
  cmComputeComponentGraph *this_local;
  
  vVar1 = this->TarjanWalkId;
  nl._4_4_ = i;
  pcStack_10 = this;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->TarjanVisited,(long)i);
  iVar4 = nl._4_4_;
  *pvVar5 = vVar1;
  pvVar6 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  pvVar6->Root = iVar4;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->TarjanComponents,(long)nl._4_4_);
  *pvVar5 = -1;
  iVar4 = this->TarjanIndex + 1;
  this->TarjanIndex = iVar4;
  pvVar6 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  pvVar6->VisitIndex = iVar4;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            (&this->TarjanStack,(value_type *)((long)&nl + 4));
  ni._M_current =
       (cmGraphEdge *)
       std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                 (&this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                  ,(long)nl._4_4_);
  local_28._M_current =
       (cmGraphEdge *)
       std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                 ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni._M_current);
  while( true ) {
    _c = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(ni._M_current);
    bVar3 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                        *)&c);
    if (!bVar3) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator*(&local_28);
    local_34 = cmGraphEdge::operator_cast_to_int(this_00);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->TarjanVisited,(long)local_34)
    ;
    if ((*pvVar5 < 1) ||
       (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->TarjanVisited,(long)local_34), this->TarjanWalkId <= *pvVar5)) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanVisited,(long)local_34);
      if (*pvVar5 == 0) {
        TarjanVisit(this,local_34);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)local_34);
      if (*pvVar5 < 0) {
        pvVar6 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)local_34);
        pvVar6 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)pvVar6->Root);
        iVar4 = pvVar6->VisitIndex;
        pvVar6 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)nl._4_4_);
        pvVar6 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)pvVar6->Root);
        if (iVar4 < pvVar6->VisitIndex) {
          pvVar6 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,(long)local_34);
          iVar4 = pvVar6->Root;
          pvVar6 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,(long)nl._4_4_);
          pvVar6->Root = iVar4;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&local_28);
  }
  pvVar6 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  if (pvVar6->Root == nl._4_4_) {
    sVar7 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(&this->Components);
    local_38 = (int)sVar7;
    local_58.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGraphNodeList::cmGraphNodeList(&local_58);
    std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::push_back
              (&this->Components,&local_58);
    cmGraphNodeList::~cmGraphNodeList(&local_58);
    pvStack_70 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                            (&this->Components,(long)local_38)->
                  super_vector<int,_std::allocator<int>_>;
    do {
      pvVar8 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->TarjanStack);
      local_74 = *pvVar8;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->TarjanStack);
      iVar4 = local_38;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)local_74);
      iVar2 = nl._4_4_;
      *pvVar5 = iVar4;
      pvVar6 = std::
               vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
               ::operator[](&this->TarjanEntries,(long)local_74);
      pvVar6->Root = iVar2;
      std::vector<int,_std::allocator<int>_>::push_back(pvStack_70,&local_74);
    } while (local_74 != nl._4_4_);
    __first = std::vector<int,_std::allocator<int>_>::begin(pvStack_70);
    __last = std::vector<int,_std::allocator<int>_>::end(pvStack_70);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(int i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = -1;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
    int j = *ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] < 0) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    int c = static_cast<int>(this->Components.size());
    this->Components.push_back(NodeList());
    NodeList& component = this->Components[c];

    // Populate the component list.
    int j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}